

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O3

void __thiscall crnlib::sparse_bit_array::resize(sparse_bit_array *this,uint size)

{
  uint32 **ppuVar1;
  ulong uVar2;
  uint uVar3;
  sparse_bit_array temp;
  sparse_bit_array local_28;
  
  uVar3 = size + 0x1ff >> 9;
  if (uVar3 != this->m_num_groups) {
    if (size + 0x1ff < 0x200) {
      clear(this);
      return;
    }
    sparse_bit_array(&local_28);
    ppuVar1 = this->m_ppGroups;
    this->m_ppGroups = local_28.m_ppGroups;
    local_28.m_num_groups = this->m_num_groups;
    this->m_num_groups = uVar3;
    local_28.m_ppGroups = ppuVar1;
    ppuVar1 = (uint32 **)crnlib_calloc((ulong)uVar3,8,(size_t *)0x0);
    this->m_ppGroups = ppuVar1;
    if (ppuVar1 == (uint32 **)0x0) {
      crnlib_assert("m_ppGroups",
                    "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_sparse_bit_array.cpp"
                    ,0x105);
    }
    uVar3 = this->m_num_groups;
    if (local_28.m_num_groups < this->m_num_groups) {
      uVar3 = local_28.m_num_groups;
    }
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        if (local_28.m_ppGroups[uVar2] != (uint32 *)0x0) {
          this->m_ppGroups[uVar2] = local_28.m_ppGroups[uVar2];
          local_28.m_ppGroups[uVar2] = (uint32 *)0x0;
        }
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    ~sparse_bit_array(&local_28);
  }
  return;
}

Assistant:

void sparse_bit_array::resize(uint size) {
  uint num_groups = (size + cBitsPerGroup - 1) >> cBitsPerGroupShift;
  if (num_groups == m_num_groups)
    return;

  if (!num_groups) {
    clear();
    return;
  }

  sparse_bit_array temp;
  temp.swap(*this);

  m_num_groups = num_groups;
  m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
  CRNLIB_VERIFY(m_ppGroups);

  uint n = math::minimum(temp.m_num_groups, m_num_groups);
  for (uint i = 0; i < n; i++) {
    uint32* p = temp.m_ppGroups[i];
    if (p) {
      m_ppGroups[i] = temp.m_ppGroups[i];
      temp.m_ppGroups[i] = NULL;
    }
  }
}